

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall
duckdb::PiecewiseMergeJoinState::ResolveJoinKeys(PiecewiseMergeJoinState *this,DataChunk *input)

{
  unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true> *this_00;
  unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
  *this_01;
  bool bVar1;
  GlobalSortState *pGVar2;
  pointer pLVar3;
  type pGVar4;
  pointer pGVar5;
  reference this_02;
  pointer pSVar6;
  type args;
  pointer this_03;
  pointer pLVar7;
  DataChunk *this_04;
  MergeSorter merge_sorter;
  uint local_74;
  MergeSorter local_70;
  
  make_uniq<duckdb::GlobalSortState,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&>
            ((duckdb *)&local_70,this->context,&this->lhs_order,&this->lhs_layout);
  pGVar2 = local_70.state;
  this_00 = &this->lhs_global_state;
  local_70.state = (GlobalSortState *)0x0;
  ::std::__uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>::
  reset((__uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_> *)
        this_00,pGVar2);
  ::std::unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>::
  ~unique_ptr((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_> *)
              &local_70);
  local_74 = 0;
  make_uniq<duckdb::PhysicalRangeJoin::LocalSortedTable,duckdb::ClientContext&,duckdb::PhysicalPiecewiseMergeJoin_const&,unsigned_int>
            ((duckdb *)&local_70,this->context,this->op,&local_74);
  pGVar2 = local_70.state;
  this_01 = &this->lhs_local_table;
  local_70.state = (GlobalSortState *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
           *)this_01,(pointer)pGVar2);
  ::std::
  unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ::~unique_ptr((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
                 *)&local_70);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  PhysicalRangeJoin::LocalSortedTable::Sink(pLVar3,input,pGVar4);
  bVar1 = this->force_external;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  pGVar5->external = bVar1;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  GlobalSortState::AddLocalState(pGVar5,&pLVar3->local_sort_state);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  GlobalSortState::PrepareMergePhase(pGVar5);
  while( true ) {
    pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(this_00);
    if ((ulong)((long)(pGVar5->sorted_blocks).
                      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pGVar5->sorted_blocks).
                     super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9) break;
    pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(this_00);
    MergeSorter::MergeSorter(&local_70,pGVar4,this->buffer_manager);
    MergeSorter::PerformInMergeRound(&local_70);
    pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(this_00);
    GlobalSortState::CompleteMergeRound(pGVar5,false);
    MergeSorter::~MergeSorter(&local_70);
  }
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  this_02 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::get<true>(&pGVar5->sorted_blocks,0);
  pSVar6 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->(this_02);
  args = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator*
                   (&pSVar6->payload_data);
  pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  make_uniq<duckdb::PayloadScanner,duckdb::SortedData&,duckdb::GlobalSortState&>
            ((duckdb *)&local_70,args,pGVar4);
  pGVar2 = local_70.state;
  local_70.state = (GlobalSortState *)0x0;
  ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
  reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
        &this->scanner,(pointer)pGVar2);
  ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
  ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
              &local_70);
  this_04 = &this->lhs_payload;
  DataChunk::Reset(this_04);
  this_03 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(&this->scanner);
  PayloadScanner::Scan(this_03,this_04);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  DataChunk::Reset(&pLVar3->keys);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  pLVar7 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  ExpressionExecutor::Execute(&pLVar3->executor,this_04,&pLVar7->keys);
  return;
}

Assistant:

void ResolveJoinKeys(DataChunk &input) {
		// sort by join key
		lhs_global_state = make_uniq<GlobalSortState>(context, lhs_order, lhs_layout);
		lhs_local_table = make_uniq<LocalSortedTable>(context, op, 0U);
		lhs_local_table->Sink(input, *lhs_global_state);

		// Set external (can be forced with the PRAGMA)
		lhs_global_state->external = force_external;
		lhs_global_state->AddLocalState(lhs_local_table->local_sort_state);
		lhs_global_state->PrepareMergePhase();
		while (lhs_global_state->sorted_blocks.size() > 1) {
			MergeSorter merge_sorter(*lhs_global_state, buffer_manager);
			merge_sorter.PerformInMergeRound();
			lhs_global_state->CompleteMergeRound();
		}

		// Scan the sorted payload
		D_ASSERT(lhs_global_state->sorted_blocks.size() == 1);

		scanner = make_uniq<PayloadScanner>(*lhs_global_state->sorted_blocks[0]->payload_data, *lhs_global_state);
		lhs_payload.Reset();
		scanner->Scan(lhs_payload);

		// Recompute the sorted keys from the sorted input
		lhs_local_table->keys.Reset();
		lhs_local_table->executor.Execute(lhs_payload, lhs_local_table->keys);
	}